

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability-test.c++
# Opt level: O2

Promise<void> __thiscall
capnp::_::anon_unknown_0::TestInterfaceDynamicImpl::call
          (TestInterfaceDynamicImpl *this,Method method,
          CallContext<capnp::DynamicStruct,_capnp::DynamicStruct> context)

{
  Reader reader;
  bool bVar1;
  ReaderFor<bool> RVar2;
  int32_t iVar3;
  long in_RSI;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  Reader methodName;
  ReaderFor<DynamicStruct> local_770;
  DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> _kjCondition_2;
  Maybe<capnp::MessageSize> local_578;
  DebugComparison<int,_int> _kjCondition;
  Reader local_3c8;
  Reader params_1;
  Reader params;
  int local_1c0 [100];
  
  _kjCondition_2.left.ptr.field_1.value.file = (char *)method.proto._reader._32_8_;
  _kjCondition_2.left.ptr.field_1._32_8_ = method.proto._reader._40_8_;
  _kjCondition_2.left.ptr.field_1.value.ownFile.content.size_ = (size_t)method.proto._reader.data;
  _kjCondition_2.left.ptr.field_1.value.ownFile.content.disposer =
       (ArrayDisposer *)method.proto._reader.pointers;
  _kjCondition_2.left.ptr._0_8_ = method.proto._reader.segment;
  _kjCondition_2.left.ptr.field_1.value.ownFile.content.ptr = (char *)method.proto._reader.capTable;
  methodName = capnp::schema::Method::Reader::getName((Reader *)&_kjCondition_2);
  _kjCondition_2.left.ptr._0_8_ = anon_var_dwarf_3ca9f;
  _kjCondition_2.left.ptr.field_1.value.ownFile.content.ptr = &DAT_00000004;
  bVar1 = kj::ArrayPtr<const_char>::operator==
                    ((ArrayPtr<const_char> *)&methodName,(ArrayPtr<const_char> *)&_kjCondition_2);
  if (bVar1) {
    **(int **)(in_RSI + 0x20) = **(int **)(in_RSI + 0x20) + 1;
    CallContext<capnp::DynamicStruct,_capnp::DynamicStruct>::getParams(&params,&context);
    name.content.size_ = 2;
    name.content.ptr = "i";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_2,&params,name);
    iVar3 = DynamicValue::Reader::AsImpl<int,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_2);
    _kjCondition.result = iVar3 == 0x7b;
    _kjCondition.left = 0x7b;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.right = iVar3;
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_2);
    if ((iVar3 != 0x7b) && (kj::_::Debug::minSeverity < 3)) {
      local_1c0[0] = 0x7b;
      name_00.content.size_ = 2;
      name_00.content.ptr = "i";
      DynamicStruct::Reader::get((Reader *)&_kjCondition_2,&params,name_00);
      local_3c8.schema.super_Schema.raw._0_4_ =
           DynamicValue::Reader::AsImpl<int,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_2);
      kj::_::Debug::log<char_const(&)[54],kj::_::DebugComparison<int,int>&,int,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x1f5,ERROR,
                 "\"failed: expected \" \"(123) == (params.get(\\\"i\\\").as<int>())\", _kjCondition, 123, params.get(\"i\").as<int>()"
                 ,(char (*) [54])"failed: expected (123) == (params.get(\"i\").as<int>())",
                 &_kjCondition,local_1c0,(int *)&local_3c8);
      DynamicValue::Reader::~Reader((Reader *)&_kjCondition_2);
    }
    name_01.content.size_ = 2;
    name_01.content.ptr = "j";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_2,&params,name_01);
    RVar2 = DynamicValue::Reader::AsImpl<bool,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_2);
    _kjCondition.left = CONCAT31(_kjCondition.left._1_3_,RVar2);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_2);
    if (kj::_::Debug::minSeverity < 3 && !RVar2) {
      kj::_::Debug::log<char_const(&)[44],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x1f6,ERROR,
                 "\"failed: expected \" \"params.get(\\\"j\\\").as<bool>()\", _kjCondition",
                 (char (*) [44])"failed: expected params.get(\"j\").as<bool>()",
                 (DebugExpression<bool> *)&_kjCondition);
    }
    local_578.ptr.isSet = false;
    CallContext<capnp::DynamicStruct,_capnp::DynamicStruct>::getResults
              ((Builder *)&_kjCondition,&context,&local_578);
    _kjCondition_2.left.ptr._0_4_ = 6;
    _kjCondition_2.left.ptr.field_1.value.ownFile.content.ptr = "foo";
    _kjCondition_2.left.ptr.field_1.value.ownFile.content.size_ = 4;
    name_03.content.size_ = 2;
    name_03.content.ptr = "x";
    DynamicStruct::Builder::set((Builder *)&_kjCondition,name_03,(Reader *)&_kjCondition_2);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_2);
  }
  else {
    _kjCondition_2.left.ptr._0_8_ = (long)"foo\n\tbaz" + 5;
    _kjCondition_2.left.ptr.field_1.value.ownFile.content.ptr = &DAT_00000004;
    bVar1 = kj::ArrayPtr<const_char>::operator==
                      ((ArrayPtr<const_char> *)&methodName,(ArrayPtr<const_char> *)&_kjCondition_2);
    if (bVar1) {
      **(int **)(in_RSI + 0x20) = **(int **)(in_RSI + 0x20) + 1;
      CallContext<capnp::DynamicStruct,_capnp::DynamicStruct>::getParams(&params_1,&context);
      name_02.content.size_ = 2;
      name_02.content.ptr = "s";
      DynamicStruct::Reader::get((Reader *)&_kjCondition_2,&params_1,name_02);
      DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                (&local_770,(Reader *)&_kjCondition_2);
      reader.reader.segment = local_770.reader.segment;
      reader.schema.super_Schema.raw = local_770.schema.super_Schema.raw;
      reader.reader.capTable = local_770.reader.capTable;
      reader.reader.data = local_770.reader.data;
      reader.reader.pointers = local_770.reader.pointers;
      reader.reader.dataSize = local_770.reader.dataSize;
      reader.reader.pointerCount = local_770.reader.pointerCount;
      reader.reader._38_2_ = local_770.reader._38_2_;
      reader.reader.nestingLimit = local_770.reader.nestingLimit;
      reader.reader._44_4_ = local_770.reader._44_4_;
      checkDynamicTestMessage(reader);
      DynamicValue::Reader::~Reader((Reader *)&_kjCondition_2);
      (*(context.hook)->_vptr_CallContextHook[1])();
      CallContext<capnp::DynamicStruct,_capnp::DynamicStruct>::getParams(&local_3c8,&context);
      _kjCondition.left = _kjCondition.left & 0xffffff00;
      kj::Maybe<kj::Exception>::Maybe
                ((Maybe<kj::Exception> *)&params,(Maybe<kj::Exception> *)&_kjCondition);
      kj::_::DebugExpression<kj::Maybe<kj::Exception>>::operator!=
                (&_kjCondition_2,(DebugExpression<kj::Maybe<kj::Exception>> *)&params,
                 (None *)&kj::none);
      kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&params);
      kj::_::NullableValue<kj::Exception>::~NullableValue
                ((NullableValue<kj::Exception> *)&_kjCondition);
      if ((_kjCondition_2.result == false) && (kj::_::Debug::minSeverity < 3)) {
        kj::_::Debug::
        log<char_const(&)[89],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
                   ,0x1fe,ERROR,
                   "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { context.getParams(); }) != kj::none\", _kjCondition"
                   ,(char (*) [89])
                    "failed: expected ::kj::runCatchingExceptions([&]() { context.getParams(); }) != kj::none"
                   ,&_kjCondition_2);
      }
      kj::_::NullableValue<kj::Exception>::~NullableValue
                ((NullableValue<kj::Exception> *)&_kjCondition_2);
    }
    else {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[23],capnp::Text::Reader&>
                ((Fault *)&_kjCondition_2,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x201,UNIMPLEMENTED,(char *)0x0,"\"Method not implemented\", methodName",
                 (char (*) [23])"Method not implemented",&methodName);
      kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition_2);
    }
  }
  kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> call(InterfaceSchema::Method method,
                         CallContext<DynamicStruct, DynamicStruct> context) override {
    auto methodName = method.getProto().getName();
    if (methodName == "foo") {
      ++callCount;
      auto params = context.getParams();
      EXPECT_EQ(123, params.get("i").as<int>());
      EXPECT_TRUE(params.get("j").as<bool>());
      context.getResults().set("x", "foo");
      return kj::READY_NOW;
    } else if (methodName == "baz") {
      ++callCount;
      auto params = context.getParams();
      checkDynamicTestMessage(params.get("s").as<DynamicStruct>());
      context.releaseParams();
      EXPECT_ANY_THROW(context.getParams());
      return kj::READY_NOW;
    } else {
      KJ_UNIMPLEMENTED("Method not implemented", methodName) { break; }
      return kj::READY_NOW;
    }
  }